

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall File::~File(File *this)

{
  File *this_local;
  
  if ((this->hasParser & 1U) != 0) {
    ts_tree_delete(this->tree);
    ts_parser_delete(this->parser);
  }
  UtfHandler::~UtfHandler(&this->utf);
  TextBuffer::~TextBuffer(&this->buffer);
  std::__cxx11::string::~string((string *)&this->languageId);
  Uri::Uri::~Uri(&this->uri);
  return;
}

Assistant:

File::~File () {
    if (hasParser) {
        ts_tree_delete(tree);
        ts_parser_delete(parser);
    }
}